

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbustraytypes.cpp
# Opt level: O0

QDBusArgument * operator<<(QDBusArgument *argument,QXdgDBusToolTipStruct *toolTip)

{
  QString *in_RSI;
  QDBusArgument *in_RDI;
  
  QDBusArgument::beginStructure();
  QDBusArgument::operator<<(in_RDI,in_RSI);
  operator<<(argument,(QXdgDBusImageVector *)toolTip);
  QDBusArgument::operator<<(in_RDI,in_RSI + 0x30);
  QDBusArgument::operator<<(in_RDI,in_RSI + 0x48);
  QDBusArgument::endStructure();
  return in_RDI;
}

Assistant:

const QDBusArgument &operator<<(QDBusArgument &argument, const QXdgDBusToolTipStruct &toolTip)
{
    argument.beginStructure();
    argument << toolTip.icon;
    argument << toolTip.image;
    argument << toolTip.title;
    argument << toolTip.subTitle;
    argument.endStructure();
    return argument;
}